

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposition.hpp
# Opt level: O2

bool __thiscall diy::detail::Div<float>::operator<(Div<float> *this,Div<float> rhs)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  float fVar6;
  
  fVar6 = rhs.b_size;
  fVar1 = this->b_size;
  if ((fVar1 == fVar6) && (!NAN(fVar1) && !NAN(fVar6))) {
    iVar2 = this->nb;
    iVar4 = rhs.nb;
    bVar5 = SBORROW4(iVar2,iVar4);
    iVar3 = iVar2 - iVar4;
    if (iVar2 == iVar4) {
      bVar5 = SBORROW4(this->dim,rhs.dim);
      iVar3 = this->dim - rhs.dim;
    }
    return bVar5 != iVar3 < 0;
  }
  return fVar6 < fVar1;
}

Assistant:

bool operator<(Div rhs) const
    {
        // sort on second value of the pair unless tied, in which case sort on first
        if (b_size == rhs.b_size)
        {
            if (nb == rhs.nb)
                return(dim < rhs.dim);
            return(nb < rhs.nb);
        }
        return(b_size > rhs.b_size);
    }